

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall Catch::JunitReporter::JunitReporter(JunitReporter *this,ReporterConfig *_config)

{
  ReporterConfig *_config_local;
  JunitReporter *this_local;
  
  CumulativeReporterBase::CumulativeReporterBase(&this->super_CumulativeReporterBase,_config);
  (this->super_CumulativeReporterBase).super_ReporterBase.super_IEventListener._vptr_IEventListener
       = (_func_int **)&PTR__JunitReporter_003a74d8;
  XmlWriter::XmlWriter(&this->xml,(this->super_CumulativeReporterBase).super_ReporterBase.m_stream);
  Timer::Timer(&this->suiteTimer);
  std::__cxx11::string::string((string *)&this->stdOutForSuite);
  std::__cxx11::string::string((string *)&this->stdErrForSuite);
  this->unexpectedExceptions = 0;
  this->m_okToFail = false;
  (this->super_CumulativeReporterBase).super_ReporterBase.super_IEventListener.m_preferences.
  shouldRedirectStdOut = true;
  (this->super_CumulativeReporterBase).super_ReporterBase.super_IEventListener.m_preferences.
  shouldReportAllAssertions = true;
  (this->super_CumulativeReporterBase).m_shouldStoreSuccesfulAssertions = false;
  return;
}

Assistant:

JunitReporter::JunitReporter( ReporterConfig&& _config )
        :   CumulativeReporterBase( CATCH_MOVE(_config) ),
            xml( m_stream )
        {
            m_preferences.shouldRedirectStdOut = true;
            m_preferences.shouldReportAllAssertions = true;
            m_shouldStoreSuccesfulAssertions = false;
        }